

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O0

KeyIndexStorage * __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>::shrink
          (KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
           *this,uint shrinkBatchSize,string *newIndexFileName)

{
  uint uVar1;
  iterator iVar2;
  iterator iVar3;
  string *in_RCX;
  uint in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  KeyIndexStorage *in_RDI;
  KeyIndexStorage actualExportedKeys;
  KeyIndexStorage sortedBatch;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  notSortedKeys;
  string batchFileName;
  size_t batchI;
  uint sortedStorageSize;
  KeyIndexStorage exportedKeys;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
  sortedBatches;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  tempFilesLock;
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
  notSortedKeysStream;
  size_t batchesCount;
  string tempSortedIndexFilename;
  string shrinkFilenamePrefix;
  KeyIndexStorage *updatedIndex;
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
  *in_stack_fffffffffffffbb8;
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
  *in_stack_fffffffffffffbc0;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  *this_00;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbe0;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  KeyIndexStorage *__lhs_00;
  undefined1 local_3f0 [104];
  string local_388 [16];
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  *in_stack_fffffffffffffc88;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  *in_stack_fffffffffffffc90;
  string local_368 [16];
  string *in_stack_fffffffffffffca8;
  uint in_stack_fffffffffffffcb4;
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
  *in_stack_fffffffffffffcb8;
  string local_270 [8];
  InnerRegisterSupplier *in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffda4;
  shared_ptr<supermap::io::FileManager> *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 uVar4;
  byte bVar5;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  _func_int **in_stack_fffffffffffffde8;
  Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_supermap::CountingStorageInfo<unsigned_int,_void>_>_>
  in_stack_fffffffffffffdf0;
  uint in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  _Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_void>_*,_false>
  in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  anon_class_4_1_4c1cc3bf in_stack_fffffffffffffe0c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe10;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  local_1d0;
  uint local_194;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  ulong local_118;
  uint local_10c;
  char local_108 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [2];
  ulong local_80;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  string *local_20;
  uint local_14;
  
  __lhs_00 = in_RDI;
  local_20 = in_RCX;
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)__lhs_00,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(&local_41);
  std::operator+(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  uVar1 = OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
          ::getItemsCount((OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
                           *)in_stack_fffffffffffffbc0);
  local_80 = (ulong)((uVar1 - 1) + local_14) / (ulong)local_14;
  getNotSortedKeys(in_stack_fffffffffffffbb8);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::vector((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
            *)0x1720c4);
  __lhs = local_c0;
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
  ::vector((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
            *)0x1720d6);
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
  ::reserve((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
             *)in_RSI,(size_type)__lhs_00);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::reserve((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
             *)in_RDI,(size_type)__lhs);
  exportKeys(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8);
  __rhs = local_108;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  ::shareStorageFile((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                      *)in_stack_fffffffffffffbb8);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::push_back((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
               *)in_stack_fffffffffffffbc0,(value_type *)in_stack_fffffffffffffbb8);
  std::shared_ptr<supermap::io::TemporaryFile>::~shared_ptr
            ((shared_ptr<supermap::io::TemporaryFile> *)0x172165);
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
  ::push_back((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
               *)in_stack_fffffffffffffbc0,(value_type *)in_stack_fffffffffffffbb8);
  local_10c = OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
              ::getItemsCount((OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
                               *)in_stack_fffffffffffffbc0);
  for (local_118 = 0; local_118 < local_80; local_118 = local_118 + 1) {
    std::operator+(__lhs,__rhs);
    std::__cxx11::to_string((unsigned_long)__lhs_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_158);
    local_194 = local_10c;
    io::
    InputIterator<supermap::StorageValueIgnorer<supermap::Key<1ul>,supermap::ByteArray<1ul>>,unsigned_int,2ul,void>
    ::
    collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_int,void>::shrink(unsigned_int,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<1ul>,supermap::ByteArray<1ul>>&&,unsigned_int)_1_,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>
              ((InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
                *)in_stack_fffffffffffffe00._M_head_impl,in_stack_fffffffffffffe0c,
               in_stack_fffffffffffffdfc);
    iVar2 = std::
            vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
            ::begin((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                     *)in_stack_fffffffffffffbb8);
    iVar3 = std::
            vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
            ::end((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                   *)in_stack_fffffffffffffbb8);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe00,local_138);
    getFileManager(in_stack_fffffffffffffbb8);
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
    ::function(in_stack_fffffffffffffbd0,
               (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
                *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    in_stack_fffffffffffffbb8 =
         (KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
          *)&stack0xfffffffffffffdc8;
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void,supermap::Key<1ul>>
    ::
    SortedSingleFileIndexedStorage<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,supermap::KeyValueShrinkableStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_int,void>::shrink(unsigned_int,std::__cxx11::string_const&)::_lambda(supermap::KeyValue<supermap::Key<1ul>,unsigned_int>const&,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>const&)_1_,supermap::KeyValueShrinkableStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_int,void>::shrink(unsigned_int,std::__cxx11::string_const&)::_lambda(supermap::KeyValue<supermap::Key<1ul>,unsigned_int>const&,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>const&)_2_>
              (&local_1d0,iVar2._M_current,iVar3._M_current,0,&stack0xfffffffffffffe00,
               &stack0xfffffffffffffdf0);
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
    ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
                 *)0x172310);
    std::shared_ptr<supermap::io::FileManager>::~shared_ptr
              ((shared_ptr<supermap::io::FileManager> *)0x17231d);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    in_stack_fffffffffffffbd0 =
         (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
          *)&stack0xfffffffffffffdb8;
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
    ::shareStorageFile((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                        *)in_stack_fffffffffffffbb8);
    std::
    vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
    ::push_back((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
                 *)in_stack_fffffffffffffbc0,(value_type *)in_stack_fffffffffffffbb8);
    std::shared_ptr<supermap::io::TemporaryFile>::~shared_ptr
              ((shared_ptr<supermap::io::TemporaryFile> *)0x172365);
    std::
    vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
    ::push_back((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
                 *)in_stack_fffffffffffffbc0,(value_type *)in_stack_fffffffffffffbb8);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
    ::~SortedSingleFileIndexedStorage
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
                *)0x172389);
    std::
    vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
    ::~vector((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
               *)in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string(local_138);
  }
  uVar4 = 0;
  std::__cxx11::string::string(local_270,local_20);
  getFileManager(in_stack_fffffffffffffbb8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  ::function(in_stack_fffffffffffffbd0,
             (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
              *)CONCAT44(local_14,in_stack_fffffffffffffbc8));
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  ::SortedSingleFileIndexedStorage
            ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
              *)in_stack_fffffffffffffdc0,
             (vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
              *)in_stack_fffffffffffffdb8,(string *)CONCAT17(uVar4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffd98);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
               *)0x172632);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x17263f);
  std::__cxx11::string::~string(local_270);
  std::operator+(__lhs,__rhs);
  std::operator+(__lhs,__rhs);
  KeyValueShrinkableStorage
            ((KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
              *)in_stack_fffffffffffffe10._M_pi,
             (KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
              *)CONCAT44(in_stack_fffffffffffffe0c.sortedStorageSize,in_stack_fffffffffffffe08),
             (KeyIndexStorage *)in_stack_fffffffffffffe00._M_head_impl,
             (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             (string *)in_stack_fffffffffffffdf0._vptr_Cloneable,(size_t)in_stack_fffffffffffffde8);
  resetWith(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  ~KeyValueShrinkableStorage(in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_368);
  std::operator+(__lhs,__rhs);
  exportKeys(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8);
  std::__cxx11::string::~string((string *)(local_3f0 + 0x10));
  this_00 = (vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
             *)local_3f0;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  ::shareStorageFile((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                      *)in_stack_fffffffffffffbb8);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::push_back(this_00,(value_type *)in_stack_fffffffffffffbb8);
  std::shared_ptr<supermap::io::TemporaryFile>::~shared_ptr
            ((shared_ptr<supermap::io::TemporaryFile> *)0x172778);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  ::resetWith(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  bVar5 = 1;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  ::~SortedSingleFileIndexedStorage
            ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
              *)0x17279f);
  if ((bVar5 & 1) == 0) {
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
    ::~SortedSingleFileIndexedStorage
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
                *)0x1728e7);
  }
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  ::~SortedSingleFileIndexedStorage
            ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
              *)0x1728f4);
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
  ::~vector((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
             *)in_stack_fffffffffffffbd0);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::~vector((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
             *)in_stack_fffffffffffffbd0);
  io::
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
  ::~InputIterator((InputIterator<supermap::StorageValueIgnorer<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_2UL,_void>
                    *)0x17291b);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return __lhs_00;
}

Assistant:

[[nodiscard]] KeyIndexStorage shrink(IndexT shrinkBatchSize, const std::string &newIndexFileName) {

        const std::string shrinkFilenamePrefix = "shrink";
        const std::string tempSortedIndexFilename = shrinkFilenamePrefix + "-sorted-keys";

        std::size_t batchesCount = (notSortedStorage_.getItemsCount() + shrinkBatchSize - 1) / shrinkBatchSize;
        auto notSortedKeysStream = getNotSortedKeys();
        std::vector<std::shared_ptr<io::TemporaryFile>> tempFilesLock;
        std::vector<KeyIndexStorage> sortedBatches;
        sortedBatches.reserve(batchesCount + 1);
        tempFilesLock.reserve(batchesCount + 1);

        KeyIndexStorage exportedKeys = exportKeys(shrinkBatchSize, tempSortedIndexFilename);
        tempFilesLock.push_back(exportedKeys.shareStorageFile());

        sortedBatches.push_back(std::move(exportedKeys));
        IndexT sortedStorageSize = sortedStorage_.getItemsCount();
        for (std::size_t batchI = 0; batchI < batchesCount; ++batchI) {
            const std::string batchFileName = shrinkFilenamePrefix + "-batch-" + std::to_string(batchI);
            std::vector<KeyIndex> notSortedKeys = notSortedKeysStream.collectWith(
                [sortedStorageSize](ValueIgnorer &&svi, IndexT index) {
                    return KeyIndex{std::move(svi.key), index + sortedStorageSize};
                },
                shrinkBatchSize
            );
            KeyIndexStorage sortedBatch(
                notSortedKeys.begin(),
                notSortedKeys.end(),
                false,
                batchFileName,
                getFileManager(),
                [](const KeyIndex &a, const KeyIndex &b) { return a.key < b.key; },
                [](const KeyIndex &a, const KeyIndex &b) { return a.key == b.key; },
                innerRegisterSupplier_
            );
            tempFilesLock.push_back(sortedBatch.shareStorageFile());
            assert(sortedBatch.getItemsCount() > 0 && "Batch file can not be empty");
            sortedBatches.push_back(std::move(sortedBatch));
        }

        KeyIndexStorage updatedIndex(
            sortedBatches,
            newIndexFileName,
            getFileManager(),
            shrinkBatchSize,
            innerRegisterSupplier_
        );

        resetWith(KeyValueShrinkableStorage(
            *this,
            updatedIndex,
            shrinkFilenamePrefix + "-new-not-sorted",
            shrinkFilenamePrefix + "-new-sorted",
            shrinkBatchSize
        ));

        KeyIndexStorage actualExportedKeys
            = exportKeys(shrinkBatchSize, shrinkFilenamePrefix + "-actual-index");
        tempFilesLock.push_back(actualExportedKeys.shareStorageFile());
        updatedIndex.resetWith(std::move(actualExportedKeys));
        return updatedIndex;
    }